

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O0

h2o_hostinfo_getaddr_req_t *
h2o_hostinfo_getaddr
          (h2o_multithread_receiver_t *receiver,h2o_iovec_t name,h2o_iovec_t serv,int family,
          int socktype,int protocol,int flags,h2o_hostinfo_getaddr_cb cb,void *cbdata)

{
  h2o_hostinfo_getaddr_req_t *req_00;
  size_t __n;
  size_t __n_00;
  h2o_hostinfo_getaddr_req_t *req;
  int family_local;
  h2o_multithread_receiver_t *receiver_local;
  h2o_iovec_t serv_local;
  h2o_iovec_t name_local;
  
  __n_00 = serv.len;
  __n = name.len;
  req_00 = (h2o_hostinfo_getaddr_req_t *)h2o_mem_alloc(__n + __n_00 + 0x6a);
  req_00->_receiver = receiver;
  req_00->_cb = cb;
  req_00->cbdata = cbdata;
  (req_00->_pending).next = (st_h2o_linklist_t *)0x0;
  (req_00->_pending).prev = (st_h2o_linklist_t *)0x0;
  (req_00->field_4)._in.name = (char *)(req_00 + 1);
  memcpy((req_00->field_4)._in.name,name.base,__n);
  (req_00->field_4)._in.name[__n] = '\0';
  (req_00->field_4)._in.serv = (req_00->field_4)._in.name + __n + 1;
  memcpy((req_00->field_4)._in.serv,serv.base,__n_00);
  (req_00->field_4)._in.serv[__n_00] = '\0';
  memset((void *)((long)&req_00->field_4 + 0x10),0,0x30);
  (req_00->field_4)._in.hints.ai_family = family;
  (req_00->field_4)._in.hints.ai_socktype = socktype;
  (req_00->field_4)._in.hints.ai_protocol = protocol;
  (req_00->field_4)._in.hints.ai_flags = flags;
  h2o__hostinfo_getaddr_dispatch(req_00);
  return req_00;
}

Assistant:

h2o_hostinfo_getaddr_req_t *h2o_hostinfo_getaddr(h2o_multithread_receiver_t *receiver, h2o_iovec_t name, h2o_iovec_t serv,
                                                 int family, int socktype, int protocol, int flags, h2o_hostinfo_getaddr_cb cb,
                                                 void *cbdata)
{
    h2o_hostinfo_getaddr_req_t *req = h2o_mem_alloc(sizeof(*req) + name.len + 1 + serv.len + 1);
    req->_receiver = receiver;
    req->_cb = cb;
    req->cbdata = cbdata;
    req->_pending = (h2o_linklist_t){NULL};
    req->_in.name = (char *)req + sizeof(*req);
    memcpy(req->_in.name, name.base, name.len);
    req->_in.name[name.len] = '\0';
    req->_in.serv = req->_in.name + name.len + 1;
    memcpy(req->_in.serv, serv.base, serv.len);
    req->_in.serv[serv.len] = '\0';
    memset(&req->_in.hints, 0, sizeof(req->_in.hints));
    req->_in.hints.ai_family = family;
    req->_in.hints.ai_socktype = socktype;
    req->_in.hints.ai_protocol = protocol;
    req->_in.hints.ai_flags = flags;

    h2o__hostinfo_getaddr_dispatch(req);

    return req;
}